

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O3

UINT8 Pulse_WriteData(void *drvObj,UINT32 dataSize,void *data)

{
  UINT8 UVar1;
  int iVar2;
  DRV_PULSE *drv;
  undefined8 in_R8;
  undefined8 in_R9;
  
  UVar1 = '\x02';
  if (dataSize <= *(uint *)((long)drvObj + 0x1c)) {
    iVar2 = pa_simple_write(*(undefined8 *)((long)drvObj + 0x48),data,dataSize,0,in_R8,in_R9,2);
    UVar1 = -(0 < iVar2);
  }
  return UVar1;
}

Assistant:

UINT8 Pulse_WriteData(void* drvObj, UINT32 dataSize, void* data)
{
	DRV_PULSE* drv = (DRV_PULSE*)drvObj;
	int retVal;
	
	if (dataSize > drv->bufSize)
		return AERR_TOO_MUCH_DATA;
	
	retVal = pa_simple_write(drv->hPulse, data, (size_t) dataSize, NULL);
	if (retVal > 0)
		return 0xFF;
	
	return AERR_OK;
}